

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.h
# Opt level: O0

void * Js::JavascriptOperators::JitRecyclerAlloc<Js::DynamicObject>(size_t size,Recycler *recycler)

{
  char *pcVar1;
  TrackAllocData local_40;
  Recycler *local_18;
  Recycler *recycler_local;
  size_t size_local;
  
  local_18 = recycler;
  recycler_local = (Recycler *)size;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_40,(type_info *)&DynamicObject::typeinfo,size - 0x20,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Language/JavascriptOperators.h"
             ,0x295);
  Memory::Recycler::TrackAllocInfo(recycler,&local_40);
  pcVar1 = Memory::Recycler::AllocZero(local_18,(size_t)recycler_local);
  return pcVar1;
}

Assistant:

static void * JitRecyclerAlloc(DECLSPEC_GUARD_OVERFLOW size_t size, Recycler* recycler)
        {
            TRACK_ALLOC_INFO(recycler, T, Recycler, size - sizeof(T), (size_t)-1);
            return recycler->AllocZero(size);
        }